

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableGenerator.cpp
# Opt level: O2

void ShuffleDeck16(PCGRandom *prng,uint16_t *deck,uint32_t count)

{
  ulong uVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint16_t uVar6;
  ulong uVar7;
  
  *deck = 0;
  iVar3 = count - 1;
  if (0x100 < count) {
    uVar7 = 1;
    for (; uVar2 = siamese::PCGRandom::Next(prng), iVar3 != 0; iVar3 = iVar3 + -2) {
      if (iVar3 == 1) {
        uVar5 = uVar2 & 0xffff;
        goto LAB_00101de7;
      }
      uVar1 = (ulong)(uVar2 & 0xffff) % uVar7;
      deck[uVar7] = deck[uVar1];
      uVar5 = (int)uVar7 + 1;
      deck[uVar1] = (uint16_t)uVar7;
      uVar7 = (ulong)((int)uVar7 + 2);
      uVar1 = (ulong)(uVar2 >> 0x10) % (ulong)uVar5;
      deck[uVar5] = deck[uVar1];
      deck[uVar1] = (uint16_t)uVar5;
    }
switchD_00101d95_caseD_0:
    return;
  }
  uVar5 = 4;
LAB_00101c9c:
  uVar7 = (ulong)(uVar5 - 3);
  uVar2 = siamese::PCGRandom::Next(prng);
  uVar6 = (uint16_t)(uVar5 - 3);
  switch(iVar3) {
  case 0:
    goto switchD_00101d95_caseD_0;
  case 1:
    uVar5 = uVar5 - 3;
    break;
  case 3:
    uVar1 = (ulong)(uVar2 & 0xff) % uVar7;
    deck[uVar7] = deck[uVar1];
    deck[uVar1] = uVar6;
    uVar7 = (ulong)(uVar5 - 2);
  case 2:
    uVar1 = (ulong)(uVar2 >> 8 & 0xff) % uVar7;
    deck[uVar7] = deck[uVar1];
    deck[uVar1] = (uint16_t)uVar7;
    uVar5 = (int)uVar7 + 1;
    break;
  default:
    goto switchD_00101d95_default;
  }
  uVar7 = (ulong)uVar5;
  uVar5 = uVar2 >> 0x10 & 0xff;
LAB_00101de7:
  deck[uVar7] = deck[(ulong)uVar5 % uVar7];
  deck[(ulong)uVar5 % uVar7] = (uint16_t)uVar7;
  return;
switchD_00101d95_default:
  iVar3 = iVar3 + -4;
  uVar1 = (ulong)(uVar2 & 0xff) % uVar7;
  deck[uVar7] = deck[uVar1];
  uVar4 = uVar5 - 2;
  deck[uVar1] = uVar6;
  uVar7 = (ulong)(uVar2 >> 8 & 0xff) % (ulong)uVar4;
  deck[uVar4] = deck[uVar7];
  deck[uVar7] = (uint16_t)uVar4;
  uVar4 = uVar5 - 1;
  uVar7 = (ulong)(uVar2 >> 0x10 & 0xff) % (ulong)uVar4;
  deck[uVar4] = deck[uVar7];
  deck[uVar7] = (uint16_t)uVar4;
  uVar7 = (ulong)(uVar2 >> 0x18) % (ulong)uVar5;
  deck[uVar5] = deck[uVar7];
  deck[uVar7] = (uint16_t)uVar5;
  uVar5 = uVar5 + 4;
  goto LAB_00101c9c;
}

Assistant:

void ShuffleDeck16(
    PCGRandom &prng,
    uint16_t * deck,
    const uint32_t count)
{
    deck[0] = 0;

    // If we can unroll 4 times:
    if (count <= 256)
    {
        for (uint32_t ii = 1;;)
        {
            uint32_t jj, rv = prng.Next();

            // 8-bit unroll
            switch (count - ii)
            {
            default:
                jj = (uint8_t)rv % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                jj = (uint8_t)(rv >> 8) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                jj = (uint8_t)(rv >> 16) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                jj = (uint8_t)(rv >> 24) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                break;

            case 3:
                jj = (uint8_t)rv % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
            case 2:
                jj = (uint8_t)(rv >> 8) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
            case 1:
                jj = (uint8_t)(rv >> 16) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
            case 0:
                return;
            }
        }
    }
    else
    {
        // For each deck entry:
        for (uint32_t ii = 1;;)
        {
            uint32_t jj, rv = prng.Next();

            // 16-bit unroll
            switch (count - ii)
            {
            default:
                jj = (uint16_t)rv % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                jj = (uint16_t)(rv >> 16) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                break;

            case 1:
                jj = (uint16_t)rv % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
            case 0:
                return;
            }
        }
    }
}